

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CDict *
ZSTD_initStaticCDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
          ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters ZVar1;
  ZSTD_paramSwitch_e useRowMatchFinder_00;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  ZSTD_cwksp_alloc_phase_e *pZVar7;
  undefined8 *puVar8;
  byte bVar9;
  ZSTD_CCtx_params in_stack_fffffffffffffd88;
  size_t local_188;
  undefined1 local_170 [8];
  ZSTD_cwksp ws;
  ZSTD_CCtx_params params;
  ZSTD_CDict *cdict;
  size_t neededSize;
  size_t matchStateSize;
  ZSTD_paramSwitch_e useRowMatchFinder;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dict_local;
  size_t workspaceSize_local;
  void *workspace_local;
  
  bVar9 = 0;
  useRowMatchFinder_00 = ZSTD_resolveRowMatchFinderMode(ZSTD_ps_auto,&cParams);
  sVar3 = ZSTD_sizeof_matchState(&cParams,useRowMatchFinder_00,1,0);
  sVar4 = ZSTD_cwksp_alloc_size(0x17c0);
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    local_188 = 0;
  }
  else {
    sVar5 = ZSTD_cwksp_align(dictSize,8);
    local_188 = ZSTD_cwksp_alloc_size(sVar5);
  }
  sVar5 = ZSTD_cwksp_alloc_size(0x2200);
  if (((ulong)workspace & 7) == 0) {
    ZSTD_cwksp_init((ZSTD_cwksp *)local_170,workspace,workspaceSize,ZSTD_cwksp_static_alloc);
    workspace_local = ZSTD_cwksp_reserve_object((ZSTD_cwksp *)local_170,0x17c0);
    if ((ZSTD_CDict *)workspace_local == (ZSTD_CDict *)0x0) {
      workspace_local = (void *)0x0;
    }
    else {
      ZSTD_cwksp_move(&((ZSTD_CDict *)workspace_local)->workspace,(ZSTD_cwksp *)local_170);
      if (workspaceSize < sVar4 + local_188 + sVar5 + sVar3) {
        workspace_local = (void *)0x0;
      }
      else {
        ZSTD_CCtxParams_init((ZSTD_CCtx_params *)&ws.phase,0);
        ZVar1 = cParams;
        ws.isStatic = cParams.windowLog;
        params.format = cParams.chainLog;
        ((ZSTD_CDict *)workspace_local)->useRowMatchFinder = useRowMatchFinder_00;
        ((ZSTD_CDict *)workspace_local)->compressionLevel = 0;
        pZVar7 = &ws.phase;
        puVar8 = (undefined8 *)&stack0xfffffffffffffd88;
        for (lVar6 = 0x1a; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar8 = *(undefined8 *)pZVar7;
          pZVar7 = pZVar7 + (ulong)bVar9 * -4 + 2;
          puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
        }
        cParams = ZVar1;
        sVar3 = ZSTD_initCDict_internal
                          ((ZSTD_CDict *)workspace_local,dict,dictSize,dictLoadMethod,
                           dictContentType,in_stack_fffffffffffffd88);
        uVar2 = ERR_isError(sVar3);
        if (uVar2 != 0) {
          workspace_local = (void *)0x0;
        }
      }
    }
  }
  else {
    workspace_local = (void *)0x0;
  }
  return (ZSTD_CDict *)workspace_local;
}

Assistant:

const ZSTD_CDict* ZSTD_initStaticCDict(
                                 void* workspace, size_t workspaceSize,
                           const void* dict, size_t dictSize,
                                 ZSTD_dictLoadMethod_e dictLoadMethod,
                                 ZSTD_dictContentType_e dictContentType,
                                 ZSTD_compressionParameters cParams)
{
    ZSTD_paramSwitch_e const useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(ZSTD_ps_auto, &cParams);
    /* enableDedicatedDictSearch == 1 ensures matchstate is not too small in case this CDict will be used for DDS + row hash */
    size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, useRowMatchFinder, /* enableDedicatedDictSearch */ 1, /* forCCtx */ 0);
    size_t const neededSize = ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict))
                            + (dictLoadMethod == ZSTD_dlm_byRef ? 0
                               : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void*))))
                            + ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE)
                            + matchStateSize;
    ZSTD_CDict* cdict;
    ZSTD_CCtx_params params;

    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */

    {
        ZSTD_cwksp ws;
        ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);
        cdict = (ZSTD_CDict*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CDict));
        if (cdict == NULL) return NULL;
        ZSTD_cwksp_move(&cdict->workspace, &ws);
    }

    DEBUGLOG(4, "(workspaceSize < neededSize) : (%u < %u) => %u",
        (unsigned)workspaceSize, (unsigned)neededSize, (unsigned)(workspaceSize < neededSize));
    if (workspaceSize < neededSize) return NULL;

    ZSTD_CCtxParams_init(&params, 0);
    params.cParams = cParams;
    params.useRowMatchFinder = useRowMatchFinder;
    cdict->useRowMatchFinder = useRowMatchFinder;
    cdict->compressionLevel = ZSTD_NO_CLEVEL;

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                              dict, dictSize,
                                              dictLoadMethod, dictContentType,
                                              params) ))
        return NULL;

    return cdict;
}